

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

int nn_sws_send(nn_pipebase *self,nn_msg *msg)

{
  nn_msg *self_00;
  nn_chunkref *self_01;
  byte bVar1;
  nn_cmsghdr *cmsg;
  size_t sVar2;
  size_t sVar3;
  ulong val;
  uint8_t *puVar4;
  nn_cmsghdr *pnVar5;
  char *pcVar6;
  int *piVar7;
  int *in_R8;
  undefined8 uVar8;
  size_t sStack_a0;
  uint8_t rand_mask [4];
  int mask_pos;
  nn_msghdr msghdr;
  nn_iovec iov [3];
  
  piVar7 = &self[-0x1a].out.type;
  if (self == (nn_pipebase *)0x0) {
    piVar7 = (int *)0x0;
  }
  if (piVar7[0x16] == 4) {
    if (piVar7[0x5e8] == 1) {
      self_00 = (nn_msg *)(piVar7 + 0x5ee);
      nn_msg_term(self_00);
      nn_msg_mv(self_00,msg);
      *(undefined8 *)((long)piVar7 + 0x17aa) = 0;
      *(undefined8 *)(piVar7 + 0x5e9) = 0;
      msghdr.msg_iov = (nn_iovec *)0x0;
      msghdr.msg_iovlen = 0;
      msghdr.msg_controllen = nn_chunkref_size((nn_chunkref *)(piVar7 + 0x5f6));
      if (msghdr.msg_controllen == 0) {
LAB_00132944:
        cmsg = (nn_cmsghdr *)0x0;
      }
      else {
        msghdr.msg_control = nn_chunkref_data((nn_chunkref *)(piVar7 + 0x5f6));
        cmsg = (nn_cmsghdr *)0x0;
        do {
          cmsg = nn_cmsg_nxthdr_(&msghdr,cmsg);
          if (cmsg == (nn_cmsghdr *)0x0) goto LAB_00132944;
        } while ((cmsg->cmsg_level != -4) || (cmsg->cmsg_type != 1));
      }
      pnVar5 = cmsg + 1;
      if (cmsg == (nn_cmsghdr *)0x0) {
        pnVar5 = (nn_cmsghdr *)(piVar7 + 0x17);
      }
      *(byte *)(piVar7 + 0x5e9) = (byte)pnVar5->cmsg_len | 0x80;
      sVar2 = nn_chunkref_size((nn_chunkref *)self_00);
      self_01 = (nn_chunkref *)(piVar7 + 0x5fe);
      sVar3 = nn_chunkref_size(self_01);
      val = sVar3 + sVar2;
      bVar1 = *(byte *)((long)piVar7 + 0x17a5);
      if (val < 0x7e) {
        *(byte *)((long)piVar7 + 0x17a5) = bVar1 | (byte)val;
        sStack_a0 = 2;
      }
      else if (val < 0x10000) {
        *(byte *)((long)piVar7 + 0x17a5) = bVar1 | 0x7e;
        nn_puts((uint8_t *)((long)piVar7 + 0x17a6),(uint16_t)val);
        sStack_a0 = 4;
      }
      else {
        *(byte *)((long)piVar7 + 0x17a5) = bVar1 | 0x7f;
        nn_putll((uint8_t *)((long)piVar7 + 0x17a6),val);
        sStack_a0 = 10;
      }
      if (piVar7[0x18] == 2) {
LAB_00132a5d:
        iov[0].iov_base = piVar7 + 0x5e9;
        iov[0].iov_len = sStack_a0;
        iov[1].iov_base = nn_chunkref_data((nn_chunkref *)self_00);
        iov[1].iov_len = nn_chunkref_size((nn_chunkref *)self_00);
        iov[2].iov_base = nn_chunkref_data(self_01);
        iov[2].iov_len = nn_chunkref_size(self_01);
        nn_usock_send(*(nn_usock **)(piVar7 + 0x1a),iov,3);
        piVar7[0x5e8] = 2;
        return 0;
      }
      if (piVar7[0x18] == 1) {
        *(byte *)((long)piVar7 + 0x17a5) = *(byte *)((long)piVar7 + 0x17a5) | 0x80;
        nn_random_generate(rand_mask,4);
        *(uint8_t (*) [4])((long)piVar7 + sStack_a0 + 0x17a4) = rand_mask;
        sStack_a0 = sStack_a0 + 4;
        mask_pos = 0;
        puVar4 = (uint8_t *)nn_chunkref_data((nn_chunkref *)self_00);
        sVar2 = nn_chunkref_size((nn_chunkref *)self_00);
        nn_sws_mask_payload(puVar4,sVar2,rand_mask,(size_t)&mask_pos,in_R8);
        puVar4 = (uint8_t *)nn_chunkref_data(self_01);
        sVar2 = nn_chunkref_size(self_01);
        nn_sws_mask_payload(puVar4,sVar2,rand_mask,(size_t)&mask_pos,in_R8);
        goto LAB_00132a5d;
      }
      nn_backtrace_print();
      pcVar6 = "0";
      uVar8 = 0x1ce;
    }
    else {
      nn_backtrace_print();
      pcVar6 = "sws->outstate == NN_SWS_OUTSTATE_IDLE";
      uVar8 = 0x17d;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,uVar8);
  }
  else {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)piVar7[0x16],
            "NN_SWS_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0x17c);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_sws_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sws *sws;
    struct nn_iovec iov [3];
    int mask_pos;
    size_t nn_msg_size;
    size_t hdr_len;
    struct nn_cmsghdr *cmsg;
    struct nn_msghdr msghdr;
    uint8_t rand_mask [NN_SWS_FRAME_SIZE_MASK];

    sws = nn_cont (self, struct nn_sws, pipebase);

    nn_assert_state (sws, NN_SWS_STATE_ACTIVE);
    nn_assert (sws->outstate == NN_SWS_OUTSTATE_IDLE);

    /*  Move the message to the local storage. */
    nn_msg_term (&sws->outmsg);
    nn_msg_mv (&sws->outmsg, msg);

    memset (sws->outhdr, 0, sizeof (sws->outhdr));

    hdr_len = NN_SWS_FRAME_SIZE_INITIAL;

    cmsg = NULL;
    msghdr.msg_iov = NULL;
    msghdr.msg_iovlen = 0;
    msghdr.msg_controllen = nn_chunkref_size (&sws->outmsg.hdrs);

    /*  If the outgoing message has specified an opcode and control framing in
        its header, properly frame it as per RFC 6455 5.2. */
    if (msghdr.msg_controllen > 0) {
        msghdr.msg_control = nn_chunkref_data (&sws->outmsg.hdrs);
        cmsg = NN_CMSG_FIRSTHDR (&msghdr);
        while (cmsg) {
            if (cmsg->cmsg_level == NN_WS && cmsg->cmsg_type == NN_WS_MSG_TYPE)
                break;
            cmsg = NN_CMSG_NXTHDR (&msghdr, cmsg);
        }
    }

    /*  If the header does not specify an opcode, take default from option. */
    if (cmsg)
        sws->outhdr [0] = *(uint8_t *) NN_CMSG_DATA (cmsg);
    else
        sws->outhdr [0] = sws->msg_type;

    /*  For now, enforce that outgoing messages are the final frame. */
    sws->outhdr [0] |= NN_SWS_FRAME_BITMASK_FIN;

    nn_msg_size = nn_chunkref_size (&sws->outmsg.sphdr) +
        nn_chunkref_size (&sws->outmsg.body);

    /*  Framing WebSocket payload size in network byte order (big endian). */
    if (nn_msg_size <= NN_SWS_PAYLOAD_MAX_LENGTH) {
        sws->outhdr [1] |= (uint8_t) nn_msg_size;
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_0;
    }
    else if (nn_msg_size <= NN_SWS_PAYLOAD_MAX_LENGTH_16) {
        sws->outhdr [1] |= NN_SWS_PAYLOAD_FRAME_16;
        nn_puts (&sws->outhdr [hdr_len], (uint16_t) nn_msg_size);
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_16;
    }
    else {
        sws->outhdr [1] |= NN_SWS_PAYLOAD_FRAME_63;
        nn_putll (&sws->outhdr [hdr_len], (uint64_t) nn_msg_size);
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_63;
    }

    if (sws->mode == NN_WS_CLIENT) {
        sws->outhdr [1] |= NN_SWS_FRAME_BITMASK_MASKED;

        /*  Generate 32-bit mask as per RFC 6455 5.3. */
        nn_random_generate (rand_mask, NN_SWS_FRAME_SIZE_MASK);

        memcpy (&sws->outhdr [hdr_len], rand_mask, NN_SWS_FRAME_SIZE_MASK);
        hdr_len += NN_SWS_FRAME_SIZE_MASK;

        /*  Mask payload, beginning with header and moving to body. */
        mask_pos = 0;

        nn_sws_mask_payload (nn_chunkref_data (&sws->outmsg.sphdr),
            nn_chunkref_size (&sws->outmsg.sphdr),
            rand_mask, NN_SWS_FRAME_SIZE_MASK, &mask_pos);

        nn_sws_mask_payload (nn_chunkref_data (&sws->outmsg.body),
            nn_chunkref_size (&sws->outmsg.body),
            rand_mask, NN_SWS_FRAME_SIZE_MASK, &mask_pos);

    }
    else if (sws->mode == NN_WS_SERVER) {
        sws->outhdr [1] |= NN_SWS_FRAME_BITMASK_NOT_MASKED;
    }
    else {
        /*  Developer error; sws object was not constructed properly. */
        nn_assert (0);
    }

    /*  Start async sending. */
    iov [0].iov_base = sws->outhdr;
    iov [0].iov_len = hdr_len;
    iov [1].iov_base = nn_chunkref_data (&sws->outmsg.sphdr);
    iov [1].iov_len = nn_chunkref_size (&sws->outmsg.sphdr);
    iov [2].iov_base = nn_chunkref_data (&sws->outmsg.body);
    iov [2].iov_len = nn_chunkref_size (&sws->outmsg.body);
    nn_usock_send (sws->usock, iov, 3);

    sws->outstate = NN_SWS_OUTSTATE_SENDING;

    return 0;
}